

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O3

void burst::detail::
     radix_sort_impl_bi_iteration<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>,burst::low_byte_fn,int(*)[256],int*>
               (void *first,void *last,void *buffer_begin,long param_4,long param_5,long param_6)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  size_t __n;
  
  __n = (long)last - (long)first;
  lVar5 = (long)__n >> 3;
  lVar3 = (long)*(int *)(param_5 + param_6 * 4);
  lVar6 = (long)*(int *)(param_5 + 4 + param_6 * 4);
  if (lVar5 != lVar6 || lVar5 != lVar3) {
    if (lVar5 == lVar3) {
      if (last != first) {
        memmove(buffer_begin,first,__n);
      }
    }
    else if (last != first) {
      lVar3 = param_6 * 0x400 + param_4;
      pvVar7 = last;
      do {
        uVar2 = *(ulong *)((long)pvVar7 + -8);
        pvVar7 = (void *)((long)pvVar7 + -8);
        uVar4 = (uVar2 ^ 0x8000000000000000) >> ((char)param_6 * '\b' & 0x3fU) & 0xff;
        iVar1 = *(int *)(lVar3 + uVar4 * 4);
        *(int *)(lVar3 + uVar4 * 4) = iVar1 + -1;
        *(ulong *)((long)buffer_begin + (long)iVar1 * 8 + -8) = uVar2;
      } while (pvVar7 != first);
    }
    if (lVar5 == lVar6) {
      if (last != first) {
        memmove(first,buffer_begin,__n);
        return;
      }
    }
    else if (last != first) {
      param_4 = param_4 + (param_6 + 1) * 0x400;
      do {
        uVar2 = *(ulong *)((long)buffer_begin + (__n - 8));
        uVar4 = (uVar2 ^ 0x8000000000000000) >> ((char)(param_6 + 1) * '\b' & 0x3fU) & 0xff;
        iVar1 = *(int *)(param_4 + uVar4 * 4);
        *(int *)(param_4 + uVar4 * 4) = iVar1 + -1;
        *(ulong *)((long)first + (long)iVar1 * 8 + -8) = uVar2;
        __n = __n - 8;
      } while (__n != 0);
    }
  }
  return;
}

Assistant:

void
            radix_sort_impl_bi_iteration
            (
                RandomAccessIterator1 first,
                RandomAccessIterator1 last,
                RandomAccessIterator2 buffer_begin,
                Map map,
                Radix radix,
                RandomAccessIterator3 counters,
                RandomAccessIterator4 maximums,
                std::size_t radix_number
            )
        {
            using std::distance;
            const auto range_size = distance(first, last);
            const auto buffer_end = std::next(buffer_begin, range_size);

            const auto nth_is_single = maximums[radix_number] == range_size;
            const auto n1th_is_single = maximums[radix_number + 1] == range_size;

            if (nth_is_single && n1th_is_single)
            {
                return;
            }

            if (nth_is_single)
            {
                std::move(first, last, buffer_begin);
            }
            else
            {
                dispose_backward(std::make_move_iterator(first), std::make_move_iterator(last), buffer_begin, compose(nth_radix(radix_number, radix), map), std::begin(counters[radix_number]));
            }

            if (n1th_is_single)
            {
                std::move(buffer_begin, buffer_end, first);
            }
            else
            {
                dispose_backward(std::make_move_iterator(buffer_begin), std::make_move_iterator(buffer_end), first, compose(nth_radix(radix_number + 1, radix), map), std::begin(counters[radix_number + 1]));
            }
        }